

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

void __thiscall avro::GenericArray::~GenericArray(GenericArray *this)

{
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *unaff_retaddr;
  
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(unaff_retaddr);
  GenericContainer::~GenericContainer((GenericContainer *)0x2453f6);
  return;
}

Assistant:

class AVRO_DECL GenericArray : public GenericContainer {
public:
    /**
     * The contents type for the array.
     */
    typedef std::vector<GenericDatum> Value;

    /**
     * Constructs a generic array corresponding to the given schema \p schema,
     * which should be of Avro type array.
     */
    GenericArray(const NodePtr& schema) : GenericContainer(AVRO_ARRAY, schema) {
    }

    /**
     * Returns the contents of this array.
     */
    const Value& value() const {
        return value_;
    }

    /**
     * Returns the reference to the contents of this array.
     */
    Value& value() {
        return value_;
    }
private:
    Value value_;
}